

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Error __thiscall llvm::AppleAcceleratorTable::extract(AppleAcceleratorTable *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  long in_RSI;
  error_code EC;
  error_code EC_00;
  Error local_58;
  pair<unsigned_short,_llvm::dwarf::Form> local_50;
  Form local_4c;
  uint16_t local_4a;
  uint local_48;
  Form AtomForm;
  uint16_t AtomType;
  uint i;
  uint32_t NumAtoms;
  error_category *local_38;
  error_code local_30;
  uint64_t local_20;
  uint64_t Offset;
  AppleAcceleratorTable *this_local;
  
  local_20 = 0;
  this_local = this;
  bVar1 = DataExtractor::isValidOffset((DataExtractor *)(in_RSI + 8),0x14);
  if (bVar1) {
    uVar3 = DataExtractor::getU32((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x48) = uVar3;
    uVar2 = DataExtractor::getU16((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
    *(uint16_t *)(in_RSI + 0x4c) = uVar2;
    uVar2 = DataExtractor::getU16((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
    *(uint16_t *)(in_RSI + 0x4e) = uVar2;
    uVar3 = DataExtractor::getU32((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x50) = uVar3;
    uVar3 = DataExtractor::getU32((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x54) = uVar3;
    uVar3 = DataExtractor::getU32((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
    *(uint32_t *)(in_RSI + 0x58) = uVar3;
    bVar1 = DataExtractor::isValidOffset
                      ((DataExtractor *)(in_RSI + 8),
                       (ulong)*(uint *)(in_RSI + 0x58) + (ulong)(uint)(*(int *)(in_RSI + 0x50) << 2)
                       + (ulong)(uint)(*(int *)(in_RSI + 0x54) << 3) + 0x13);
    if (bVar1) {
      uVar3 = DataExtractor::getU32((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
      *(ulong *)(in_RSI + 0x60) = (ulong)uVar3;
      _AtomForm = DataExtractor::getU32((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
      for (local_48 = 0; local_48 < _AtomForm; local_48 = local_48 + 1) {
        local_4a = DataExtractor::getU16((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
        local_4c = DataExtractor::getU16((DataExtractor *)(in_RSI + 8),&local_20,(Error *)0x0);
        local_50 = std::make_pair<unsigned_short&,llvm::dwarf::Form&>(&local_4a,&local_4c);
        SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>::push_back
                  ((SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *)
                   (in_RSI + 0x68),&local_50);
      }
      *(undefined1 *)(in_RSI + 0x88) = 1;
      Error::success();
      Error::Error((Error *)this,&local_58);
      ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_58);
    }
    else {
      std::error_code::error_code<llvm::errc,void>((error_code *)&i,illegal_byte_sequence);
      EC_00._M_cat._0_4_ = i;
      EC_00._0_8_ = this;
      EC_00._M_cat._4_4_ = 0;
      createStringError(EC_00,(char *)local_38);
    }
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_30,illegal_byte_sequence);
    EC._M_cat._0_4_ = local_30._M_value;
    EC._0_8_ = this;
    EC._M_cat._4_4_ = 0;
    createStringError(EC,(char *)local_30._M_cat);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error AppleAcceleratorTable::extract() {
  uint64_t Offset = 0;

  // Check that we can at least read the header.
  if (!AccelSection.isValidOffset(offsetof(Header, HeaderDataLength) + 4))
    return createStringError(errc::illegal_byte_sequence,
                             "Section too small: cannot read header.");

  Hdr.Magic = AccelSection.getU32(&Offset);
  Hdr.Version = AccelSection.getU16(&Offset);
  Hdr.HashFunction = AccelSection.getU16(&Offset);
  Hdr.BucketCount = AccelSection.getU32(&Offset);
  Hdr.HashCount = AccelSection.getU32(&Offset);
  Hdr.HeaderDataLength = AccelSection.getU32(&Offset);

  // Check that we can read all the hashes and offsets from the
  // section (see SourceLevelDebugging.rst for the structure of the index).
  // We need to substract one because we're checking for an *offset* which is
  // equal to the size for an empty table and hence pointer after the section.
  if (!AccelSection.isValidOffset(sizeof(Hdr) + Hdr.HeaderDataLength +
                                  Hdr.BucketCount * 4 + Hdr.HashCount * 8 - 1))
    return createStringError(
        errc::illegal_byte_sequence,
        "Section too small: cannot read buckets and hashes.");

  HdrData.DIEOffsetBase = AccelSection.getU32(&Offset);
  uint32_t NumAtoms = AccelSection.getU32(&Offset);

  for (unsigned i = 0; i < NumAtoms; ++i) {
    uint16_t AtomType = AccelSection.getU16(&Offset);
    auto AtomForm = static_cast<dwarf::Form>(AccelSection.getU16(&Offset));
    HdrData.Atoms.push_back(std::make_pair(AtomType, AtomForm));
  }

  IsValid = true;
  return Error::success();
}